

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O0

uint read_pbm_integer(j_compress_ptr cinfo,FILE *infile,uint maxval)

{
  int iVar1;
  uint uVar2;
  uint in_EDX;
  long *in_RDI;
  uint val;
  int ch;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  undefined4 in_stack_ffffffffffffffe4;
  
  do {
    iVar1 = pbm_getc((FILE *)CONCAT44(in_stack_ffffffffffffffe4,
                                      CONCAT13(in_stack_ffffffffffffffe3,
                                               CONCAT12(in_stack_ffffffffffffffe2,
                                                        in_stack_ffffffffffffffe0))));
    if (iVar1 == -1) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x2b;
      (**(code **)*in_RDI)(in_RDI);
    }
    in_stack_ffffffffffffffe3 = true;
    if (((iVar1 != 0x20) && (in_stack_ffffffffffffffe3 = true, iVar1 != 9)) &&
       (in_stack_ffffffffffffffe3 = true, iVar1 != 10)) {
      in_stack_ffffffffffffffe3 = iVar1 == 0xd;
    }
  } while ((bool)in_stack_ffffffffffffffe3 != false);
  if ((iVar1 < 0x30) || (0x39 < iVar1)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x3f7;
    (**(code **)*in_RDI)(in_RDI);
  }
  uVar2 = iVar1 - 0x30;
  while( true ) {
    iVar1 = pbm_getc((FILE *)CONCAT44(uVar2,CONCAT13(in_stack_ffffffffffffffe3,
                                                     CONCAT12(in_stack_ffffffffffffffe2,
                                                              in_stack_ffffffffffffffe0))));
    in_stack_ffffffffffffffe2 = 0x2f < iVar1 && iVar1 < 0x3a;
    if (0x2f >= iVar1 || iVar1 >= 0x3a) break;
    uVar2 = iVar1 + -0x30 + uVar2 * 10;
    if (in_EDX < uVar2) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x3f9;
      (**(code **)*in_RDI)(in_RDI);
    }
  }
  return uVar2;
}

Assistant:

LOCAL(unsigned int)
read_pbm_integer(j_compress_ptr cinfo, FILE *infile, unsigned int maxval)
/* Read an unsigned decimal integer from the PPM file */
/* Swallows one trailing character after the integer */
/* Note that on a 16-bit-int machine, only values up to 64k can be read. */
/* This should not be a problem in practice. */
{
  register int ch;
  register unsigned int val;

  /* Skip any leading whitespace */
  do {
    ch = pbm_getc(infile);
    if (ch == EOF)
      ERREXIT(cinfo, JERR_INPUT_EOF);
  } while (ch == ' ' || ch == '\t' || ch == '\n' || ch == '\r');

  if (ch < '0' || ch > '9')
    ERREXIT(cinfo, JERR_PPM_NONNUMERIC);

  val = ch - '0';
  while ((ch = pbm_getc(infile)) >= '0' && ch <= '9') {
    val *= 10;
    val += ch - '0';
    if (val > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
  }

  return val;
}